

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall cppcms::filters::anon_unknown_0::jsescape_buf::~jsescape_buf(jsescape_buf *this)

{
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::~filterbuf
            (&this->super_filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>);
  operator_delete(this);
  return;
}

Assistant:

jsescape_buf() 
			{
				buf_[0]='\\';
				buf_[1]= 'u';
				buf_[2]= '0';
				buf_[3]= '0';
				// 4 first digit
				// 5 2nd digit
				buf_[6]='\0';
			}